

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.cxx
# Opt level: O2

bool __thiscall cmGlobalGenerator::NameResolvesToFramework(cmGlobalGenerator *this,string *libname)

{
  bool bVar1;
  cmTarget *this_00;
  bool bVar2;
  
  bVar1 = cmSystemTools::IsPathToFramework(libname);
  bVar2 = true;
  if (!bVar1) {
    this_00 = FindTarget(this,libname,false);
    if ((this_00 != (cmTarget *)0x0) && (bVar1 = cmTarget::IsFrameworkOnApple(this_00), bVar1)) {
      return true;
    }
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool cmGlobalGenerator::NameResolvesToFramework(
  const std::string& libname) const
{
  if (cmSystemTools::IsPathToFramework(libname)) {
    return true;
  }

  if (cmTarget* tgt = this->FindTarget(libname)) {
    if (tgt->IsFrameworkOnApple()) {
      return true;
    }
  }

  return false;
}